

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_iterator_move_equalorlarger(roaring64_iterator_t *it,uint64_t val)

{
  art_val_t *paVar1;
  _Bool _Var2;
  _Bool _Var3;
  roaring_container_iterator_t rVar4;
  ulong uVar5;
  ulong uVar6;
  uint16_t low16;
  uint8_t val_high48 [6];
  uint16_t low16_1;
  ushort local_22;
  uint local_20;
  ushort local_1c;
  uint16_t local_1a;
  
  local_20 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_1c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  if ((it->has_value != true) || (uVar5 = it->high48, uVar5 != (val & 0xffffffffffff0000))) {
    _Var2 = art_iterator_lower_bound(&it->art_it,(art_key_chunk_t *)&local_20);
    if (!_Var2) {
      it->has_value = false;
      it->saturated_forward = true;
      return false;
    }
    uVar5 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
    uVar6 = (ulong)*(uint6 *)(it->art_it).key;
    uVar5 = (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
            (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
            uVar6 << 0x38;
    it->high48 = uVar5;
  }
  if (uVar5 == (val & 0xffffffffffff0000)) {
    paVar1 = (it->art_it).value;
    local_22 = (ushort)it->value;
    _Var2 = container_iterator_lower_bound
                      (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&it->container_it,
                       &local_22,(uint16_t)val);
    if (_Var2) {
      it->value = (ulong)local_22 | it->high48;
      _Var3 = true;
    }
    else {
      _Var3 = art_iterator_next(&it->art_it);
      if (_Var3) goto LAB_00106cb1;
      it->saturated_forward = true;
      _Var3 = false;
    }
    it->has_value = _Var3;
  }
  else {
LAB_00106cb1:
    uVar5 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
    uVar6 = (ulong)*(uint6 *)(it->art_it).key;
    it->high48 = (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                 (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                 uVar6 << 0x38;
    paVar1 = (it->art_it).value;
    local_1a = 0;
    rVar4 = container_init_iterator(*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&local_1a)
    ;
    (it->container_it).index = rVar4.index;
    it->value = (ulong)local_1a | it->high48;
    it->has_value = true;
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool roaring64_iterator_move_equalorlarger(roaring64_iterator_t *it,
                                           uint64_t val) {
    uint8_t val_high48[ART_KEY_BYTES];
    uint16_t val_low16 = split_key(val, val_high48);
    if (!it->has_value || it->high48 != (val & 0xFFFFFFFFFFFF0000)) {
        // The ART iterator is before or after the high48 bits of `val` (or
        // beyond the ART altogether), so we need to move to a leaf with a key
        // equal or greater.
        if (!art_iterator_lower_bound(&it->art_it, val_high48)) {
            // Only smaller keys found.
            it->saturated_forward = true;
            return (it->has_value = false);
        }
        it->high48 = combine_key(it->art_it.key, 0);
        // Fall through to the next if statement.
    }

    if (it->high48 == (val & 0xFFFFFFFFFFFF0000)) {
        // We're at equal high bits, check if a suitable value can be found in
        // this container.
        leaf_t *leaf = (leaf_t *)it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        if (container_iterator_lower_bound(leaf->container, leaf->typecode,
                                           &it->container_it, &low16,
                                           val_low16)) {
            it->value = it->high48 | low16;
            return (it->has_value = true);
        }
        // Only smaller entries in this container, move to the next.
        if (!art_iterator_next(&it->art_it)) {
            it->saturated_forward = true;
            return (it->has_value = false);
        }
    }

    // We're at a leaf with high bits greater than `val`, so the first entry in
    // this container is our result.
    return roaring64_iterator_init_at_leaf_first(it);
}